

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetScaledStepTol(void *kinmem,sunrealtype scsteptol)

{
  KINMem in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  sunrealtype uround;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x332,"KINSetScaledStepTol",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      in_RDI->kin_scsteptol = in_XMM0_Qa;
    }
    else {
      dVar1 = pow(in_RDI->kin_uround,0.6666666666666667);
      in_RDI->kin_scsteptol = dVar1;
    }
    local_4 = 0;
  }
  else {
    KINProcessError(in_RDI,-2,0x33a,"KINSetScaledStepTol",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"scsteptol < 0 illegal.");
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int KINSetScaledStepTol(void* kinmem, sunrealtype scsteptol)
{
  KINMem kin_mem;
  sunrealtype uround;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (scsteptol < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_SCSTEPTOL);
    return (KIN_ILL_INPUT);
  }

  if (scsteptol == ZERO)
  {
    uround                 = kin_mem->kin_uround;
    kin_mem->kin_scsteptol = SUNRpowerR(uround, TWOTHIRDS);
  }
  else { kin_mem->kin_scsteptol = scsteptol; }

  return (KIN_SUCCESS);
}